

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::AddFacesFromNodeSet
          (ChContactSurfaceNodeCloud *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
          *node_set,double point_radius)

{
  element_type *peVar1;
  bool bVar2;
  ulong uVar3;
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_58;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_48;
  double local_38;
  
  if (((this->super_ChContactSurface).m_mesh != (ChMesh *)0x0) &&
     (psVar7 = (node_set->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (node_set->
     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
     )._M_impl.super__Vector_impl_data._M_finish != psVar7)) {
    uVar3 = 0;
    uVar6 = 1;
    local_38 = point_radius;
    do {
      peVar1 = psVar7[uVar3].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        peVar4 = (element_type *)
                 __dynamic_cast(peVar1,&ChNodeFEAbase::typeinfo,&ChNodeFEAxyz::typeinfo,0);
        if (peVar4 == (element_type *)0x0) {
          peVar5 = (element_type *)
                   __dynamic_cast(peVar1,&ChNodeFEAbase::typeinfo,&ChNodeFEAxyzrot::typeinfo,0);
          if (peVar5 == (element_type *)0x0) goto LAB_0062613c;
          this_01 = psVar7[uVar3].
                    super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = this_01;
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_01->_M_use_count = this_01->_M_use_count + 1;
                UNLOCK();
                goto LAB_0062610f;
              }
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
LAB_0062610f:
          local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar5;
          AddNode(this,&local_58,local_38);
          this_00._M_pi =
               local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        }
        else {
          this_01 = psVar7[uVar3].
                    super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = this_01;
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_01->_M_use_count = this_01->_M_use_count + 1;
                UNLOCK();
                goto LAB_006260cf;
              }
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
LAB_006260cf:
          local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = peVar4;
          AddNode(this,&local_48,local_38);
          this_00._M_pi =
               local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
LAB_0062613c:
      psVar7 = (node_set->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(node_set->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4)
      ;
      uVar3 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::AddFacesFromNodeSet(std::vector<std::shared_ptr<ChNodeFEAbase> >& node_set,
                                                    const double point_radius) {
    if (!m_mesh)
        return;
    for (unsigned int i = 0; i < node_set.size(); ++i)
        if (auto mnodeFEA = std::dynamic_pointer_cast<ChNodeFEAxyz>(node_set[i]))
            this->AddNode(mnodeFEA, point_radius);
        else if (auto mnodeFEArot = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(node_set[i]))
            this->AddNode(mnodeFEArot, point_radius);
}